

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QMdiAreaPrivate::setChildActivationEnabled
          (QMdiAreaPrivate *this,bool enable,bool onlyNextActivationEvent)

{
  long lVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = (this->childWindows).d.size;
  if (lVar1 != 0) {
    pQVar2 = (this->childWindows).d.ptr;
    lVar3 = 0;
    do {
      lVar4 = *(long *)((long)&(pQVar2->wp).d + lVar3);
      if ((lVar4 == 0) || (*(int *)(lVar4 + 4) == 0)) {
        lVar4 = 0;
      }
      else {
        lVar4 = *(long *)((long)&(pQVar2->wp).value + lVar3);
      }
      if ((lVar4 != 0) && ((*(byte *)(*(long *)(lVar4 + 0x20) + 9) & 0x80) != 0)) {
        if (onlyNextActivationEvent) {
          *(bool *)(*(long *)(lVar4 + 8) + 0x2d6) = !enable;
        }
        else {
          *(bool *)(*(long *)(lVar4 + 8) + 0x2d7) = enable;
        }
      }
      lVar3 = lVar3 + 0x10;
    } while (lVar1 << 4 != lVar3);
  }
  return;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }